

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NegaMaxSearch.h
# Opt level: O1

int negamax(int alpha,int beta,int depth)

{
  int *piVar1;
  uint bestMove;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  unsigned_long_long uVar5;
  TTEntry *pTVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  moves *pmVar18;
  unsigned_long_long *puVar19;
  unsigned_long_long *puVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  bool bVar28;
  bool bVar29;
  byte bVar30;
  unsigned_long_long occupanciesCopy_1 [3];
  unsigned_long_long occupanciesCopy [3];
  moves moveList [1];
  int local_4f4;
  int local_4d4;
  int local_4d0;
  unsigned_long_long local_498;
  unsigned_long_long uStack_490;
  unsigned_long_long local_488;
  moves local_438;
  
  iVar8 = ply;
  bVar30 = 0;
  lVar17 = (long)ply;
  pvLength[lVar17] = ply;
  if (lVar17 != 0) {
    uVar13 = (ulong)repetitionIndex;
    bVar28 = 0 < (long)uVar13;
    if ((0 < (long)uVar13) && (bVar28 = true, repetitionTable[0] != hashKey)) {
      uVar7 = 1;
      do {
        uVar23 = uVar7;
        if (uVar13 == uVar23) break;
        uVar7 = uVar23 + 1;
      } while (repetitionTable[uVar23] != hashKey);
      bVar28 = uVar23 < uVar13;
    }
    if (bVar28) {
      return 0;
    }
  }
  uVar25 = 0;
  if (99 < fiftyRuleCounter) {
    return 0;
  }
  iVar26 = beta - alpha;
  if (iVar8 == 0) {
    bestMove = 0;
  }
  else {
    bestMove = 0;
    uVar13 = hashKey % (ulong)(long)hashEntries;
    uVar25 = 100000;
    if (hashTable[uVar13].hashKey == hashKey) {
      if (depth <= hashTable[uVar13].depth) {
        bestMove = 0;
        iVar24 = 0;
        if (hashTable[uVar13].score < -48000) {
          iVar24 = iVar8;
        }
        iVar9 = hashTable[uVar13].flag;
        iVar24 = iVar24 + hashTable[uVar13].score;
        iVar27 = 0;
        if (48000 < iVar24) {
          iVar27 = iVar8;
        }
        uVar25 = iVar24 - iVar27;
        if (iVar9 == 0) {
          bVar28 = false;
        }
        else if ((iVar9 == 1) && ((int)uVar25 <= alpha)) {
          bVar28 = false;
          uVar25 = alpha;
        }
        else {
          bVar28 = (int)uVar25 < beta || iVar9 != 2;
          uVar25 = beta;
        }
        if (!bVar28) goto LAB_001081e8;
      }
      bestMove = hashTable[uVar13].bestMove;
      uVar25 = 100000;
    }
LAB_001081e8:
    if (uVar25 != 100000 && iVar26 < 2) {
      return uVar25;
    }
  }
  if ((nodes & 0x7ff) == 0) {
    communicate();
  }
  if (depth == 0) {
    iVar8 = quietSearch(alpha,beta);
    return iVar8;
  }
  if (0x3f < ply) {
    iVar8 = evaluate();
    return iVar8;
  }
  nodes = nodes + 1;
  if (side == 0) {
    if (bitboardsPieces[5] == 0) goto LAB_001082bc;
    uVar13 = ~bitboardsPieces[5] & bitboardsPieces[5] - 1;
    if (uVar13 == 0) goto LAB_001082c3;
    iVar8 = 0;
    do {
      iVar8 = iVar8 + 1;
      uVar13 = uVar13 & uVar13 - 1;
    } while (uVar13 != 0);
  }
  else if (bitboardsPieces[0xb] == 0) {
LAB_001082bc:
    iVar8 = -1;
  }
  else {
    uVar13 = ~bitboardsPieces[0xb] & bitboardsPieces[0xb] - 1;
    if (uVar13 == 0) {
LAB_001082c3:
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      do {
        iVar8 = iVar8 + 1;
        uVar13 = uVar13 & uVar13 - 1;
      } while (uVar13 != 0);
    }
  }
  if (((side != 1) || (uVar21 = 1, (pawnAttacks[1][iVar8] & bitboardsPieces[0]) == 0)) &&
     ((side != 0 || (uVar21 = 1, (pawnAttacks[0][iVar8] & bitboardsPieces[6]) == 0)))) {
    lVar17 = 0x38;
    if (side == 1) {
      lVar17 = 8;
    }
    uVar21 = 1;
    if ((knightAttacks[iVar8] & *(ulong *)((long)bitboardsPieces + lVar17)) == 0) {
      lVar17 = 0x40;
      if (side == 1) {
        lVar17 = 0x10;
      }
      if ((*(ulong *)((long)bitboardsPieces + lVar17) &
          bishopAttacks[iVar8]
          [(bishopMasks[iVar8] & occupancies[2]) * bishopMagicNumbers[iVar8] >>
           (-(char)bishopRelevantBits[iVar8] & 0x3fU)]) == 0) {
        lVar17 = 0x48;
        if (side == 1) {
          lVar17 = 0x18;
        }
        if ((*(ulong *)((long)bitboardsPieces + lVar17) &
            rookAttacks[iVar8]
            [(occupancies[2] & rookMasks[iVar8]) * rookMagicNumbers[iVar8] >>
             (-(char)rookRelevantBits[iVar8] & 0x3fU)]) == 0) {
          lVar17 = 0x50;
          if (side == 1) {
            lVar17 = 0x20;
          }
          uVar21 = 1;
          if ((*(ulong *)((long)bitboardsPieces + lVar17) &
              (rookAttacks[iVar8]
               [(occupancies[2] & rookMasks[iVar8]) * rookMagicNumbers[iVar8] >>
                (-(char)rookRelevantBits[iVar8] & 0x3fU)] |
              bishopAttacks[iVar8]
              [(bishopMasks[iVar8] & occupancies[2]) * bishopMagicNumbers[iVar8] >>
               (-(char)bishopRelevantBits[iVar8] & 0x3fU)])) == 0) {
            lVar17 = 0x58;
            if (side == 1) {
              lVar17 = 0x28;
            }
            uVar21 = (uint)((kingAttacks[iVar8] & *(ulong *)((long)bitboardsPieces + lVar17)) != 0);
          }
          goto LAB_0010840c;
        }
      }
      uVar21 = 1;
    }
  }
LAB_0010840c:
  iVar27 = depth + uVar21;
  iVar9 = evaluate();
  uVar2 = hashKey;
  iVar24 = enpassant;
  iVar8 = side;
  if ((((uVar21 != 0) || (2 < iVar27)) || (1 < iVar26)) ||
     (uVar25 = iVar27 * -0x78 + iVar9, (int)uVar25 < beta)) {
    if (ply != 0 && (uVar21 == 0 && 2 < iVar27)) {
      puVar19 = bitboardsPieces;
      pmVar18 = &local_438;
      for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(unsigned_long_long *)pmVar18->moves = *puVar19;
        puVar19 = puVar19 + (ulong)bVar30 * -2 + 1;
        pmVar18 = (moves *)((long)pmVar18 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      local_488 = occupancies[2];
      local_498 = occupancies[0];
      uStack_490 = occupancies[1];
      ply = ply + 1;
      lVar17 = (long)repetitionIndex;
      repetitionIndex = repetitionIndex + 1;
      repetitionTable[lVar17 + 1] = hashKey;
      iVar12 = fiftyRuleCounter;
      iVar9 = castle;
      if ((long)enpassant != 0x40) {
        hashKey = enpassantKeys[enpassant] ^ uVar2;
      }
      enpassant = 0x40;
      side = side ^ 1;
      hashKey = hashKey ^ sideKey;
      iVar10 = negamax(-beta,1 - beta,iVar27 + -3);
      ply = ply + -1;
      repetitionIndex = repetitionIndex + -1;
      pmVar18 = &local_438;
      puVar19 = bitboardsPieces;
      for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar19 = *(unsigned_long_long *)pmVar18->moves;
        pmVar18 = (moves *)((long)pmVar18 + ((ulong)bVar30 * -2 + 1) * 8);
        puVar19 = puVar19 + (ulong)bVar30 * -2 + 1;
      }
      occupancies[2] = local_488;
      occupancies[0] = local_498;
      occupancies[1] = uStack_490;
      if (beta <= -iVar10) {
        uVar25 = beta;
      }
      if (isStopped == 1) {
        side = iVar8;
        enpassant = iVar24;
        castle = iVar9;
        hashKey = uVar2;
        fiftyRuleCounter = iVar12;
        return 0;
      }
      castle = iVar9;
      fiftyRuleCounter = iVar12;
      if (beta <= -iVar10) {
        side = iVar8;
        enpassant = iVar24;
        hashKey = uVar2;
        return uVar25;
      }
    }
    side = iVar8;
    enpassant = iVar24;
    hashKey = uVar2;
    if ((iVar26 < 2 && (char)uVar21 == '\0') && iVar27 < 4) {
      iVar8 = evaluate();
      uVar22 = iVar8 + 0x7d;
      bVar28 = true;
      if ((int)uVar22 < beta) {
        if (iVar27 == 1) {
          uVar11 = quietSearch(alpha,beta);
          uVar25 = uVar22;
          if ((int)uVar22 < (int)uVar11) {
            uVar25 = uVar11;
          }
          bVar28 = false;
        }
        else {
          uVar22 = iVar8 + 300;
          if ((((int)uVar22 < beta) && (iVar27 < 3)) &&
             (uVar11 = quietSearch(alpha,beta), (int)uVar11 < beta)) {
            uVar25 = uVar22;
            if ((int)uVar22 < (int)uVar11) {
              uVar25 = uVar11;
            }
            bVar28 = false;
          }
        }
      }
      if (!bVar28) {
        return uVar25;
      }
    }
    generateMoves(&local_438);
    if (followPV != 0) {
      followPV = 0;
      if (0 < (long)local_438.count) {
        lVar17 = 0;
        do {
          if (pvTable[0][ply] == local_438.moves[lVar17]) {
            scorePV = 1;
            followPV = 1;
          }
          lVar17 = lVar17 + 1;
        } while (local_438.count != lVar17);
      }
    }
    sortMoves(&local_438,bestMove);
    bVar28 = 0 < local_438.count;
    if (local_438.count < 1) {
      local_4d0 = 1;
      bVar29 = true;
    }
    else {
      lVar17 = 0;
      local_4d0 = 1;
      local_4f4 = 0;
      local_4d4 = 0;
      do {
        iVar9 = fiftyRuleCounter;
        uVar5 = hashKey;
        iVar24 = castle;
        iVar26 = enpassant;
        iVar8 = side;
        uVar4 = occupancies[2];
        uVar3 = occupancies[1];
        uVar2 = occupancies[0];
        puVar19 = bitboardsPieces;
        puVar20 = &local_498;
        for (lVar14 = 0xc; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar20 = *puVar19;
          puVar19 = puVar19 + (ulong)bVar30 * -2 + 1;
          puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
        }
        ply = ply + 1;
        lVar14 = (long)repetitionIndex;
        repetitionIndex = repetitionIndex + 1;
        repetitionTable[lVar14 + 1] = hashKey;
        iVar12 = makeMove(local_438.moves[lVar17],0);
        if (iVar12 == 0) {
          ply = ply + -1;
          repetitionIndex = repetitionIndex + -1;
          bVar29 = false;
        }
        else {
          if (local_4f4 == 0) {
LAB_001088a9:
            iVar12 = negamax(-beta,-alpha,iVar27 + -1);
            uVar22 = -iVar12;
          }
          else {
            if ((local_4f4 < 4 || (iVar27 < 3 || uVar21 != 0)) ||
               ((*(byte *)((long)local_438.moves + lVar17 * 4 + 2) & 0x1f) != 0)) {
              uVar22 = alpha + 1;
            }
            else {
              iVar12 = negamax(~alpha,-alpha,iVar27 + -2);
              uVar22 = -iVar12;
            }
            if (alpha < (int)uVar22) {
              iVar12 = negamax(~alpha,-alpha,iVar27 + -1);
              uVar22 = -iVar12;
              if ((SBORROW4(alpha,uVar22) != alpha + iVar12 < 0) && ((int)uVar22 < beta))
              goto LAB_001088a9;
            }
          }
          iVar12 = ply;
          lVar16 = (long)ply;
          lVar14 = lVar16 + -1;
          iVar10 = (int)lVar14;
          repetitionIndex = repetitionIndex + -1;
          puVar19 = &local_498;
          puVar20 = bitboardsPieces;
          ply = iVar10;
          for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar20 = *puVar19;
            puVar19 = puVar19 + (ulong)bVar30 * -2 + 1;
            puVar20 = puVar20 + (ulong)bVar30 * -2 + 1;
          }
          local_4d4 = local_4d4 + 1;
          bVar29 = true;
          occupancies[0] = uVar2;
          occupancies[1] = uVar3;
          occupancies[2] = uVar4;
          side = iVar8;
          enpassant = iVar26;
          castle = iVar24;
          hashKey = uVar5;
          fiftyRuleCounter = iVar9;
          if (isStopped == 1) {
            uVar25 = 0;
          }
          else {
            local_4f4 = local_4f4 + 1;
            if (alpha < (int)uVar22) {
              bestMove = local_438.moves[lVar17];
              if ((bestMove >> 0x14 & 1) == 0) {
                piVar1 = (int *)((long)historyMoves[0] +
                                (ulong)(bestMove >> 4 & 0xfc) + (ulong)(bestMove >> 4 & 0xf00));
                *piVar1 = *piVar1 + iVar27;
              }
              *(uint *)((long)pvTable + lVar14 * 0x104) = bestMove;
              iVar8 = pvLength[lVar16];
              if (iVar12 < iVar8) {
                lVar15 = 0;
                do {
                  pvTable[lVar14][lVar16 + lVar15] =
                       *(int *)((long)pvTable + lVar15 * 4 + lVar16 * 0x104);
                  lVar15 = lVar15 + 1;
                } while (iVar8 - lVar16 != lVar15);
              }
              *(int *)((long)&nodes + lVar16 * 4 + 4) = iVar8;
              pTVar6 = hashTable;
              if ((int)uVar22 < beta) {
                bVar29 = false;
              }
              else {
                iVar8 = 0;
                if (beta < -48000) {
                  iVar8 = iVar10;
                }
                iVar26 = 0;
                if (48000 < beta - iVar8) {
                  iVar26 = iVar10;
                }
                uVar13 = uVar5 % (ulong)(long)hashEntries;
                hashTable[uVar13].hashKey = uVar5;
                pTVar6[uVar13].score = iVar26 + (beta - iVar8);
                pTVar6[uVar13].flag = 2;
                pTVar6[uVar13].depth = iVar27;
                pTVar6[uVar13].bestMove = bestMove;
                uVar11 = local_438.moves[lVar17];
                uVar25 = beta;
                if ((uVar11 >> 0x14 & 1) == 0) {
                  lVar14 = (long)ply;
                  killerMoves[1][lVar14] = killerMoves[0][lVar14];
                  killerMoves[0][lVar14] = uVar11;
                }
              }
              local_4d0 = 0;
              alpha = uVar22;
            }
            else {
              bVar29 = false;
            }
          }
        }
        if (bVar29) break;
        lVar17 = lVar17 + 1;
        bVar28 = lVar17 < local_438.count;
      } while (lVar17 < local_438.count);
      bVar29 = local_4d4 == 0;
    }
    pTVar6 = hashTable;
    if (!bVar28) {
      if (bVar29) {
        if (uVar21 == 0) {
          uVar25 = 0;
        }
        else {
          uVar25 = ply - 49000;
        }
      }
      else {
        iVar8 = 0;
        if (alpha < -48000) {
          iVar8 = ply;
        }
        iVar26 = ply;
        if (alpha - iVar8 < 0xbb81) {
          iVar26 = 0;
        }
        uVar13 = hashKey % (ulong)(long)hashEntries;
        hashTable[uVar13].hashKey = hashKey;
        pTVar6[uVar13].score = iVar26 + (alpha - iVar8);
        pTVar6[uVar13].flag = local_4d0;
        pTVar6[uVar13].depth = iVar27;
        pTVar6[uVar13].bestMove = bestMove;
        uVar25 = alpha;
      }
    }
  }
  return uVar25;
}

Assistant:

static inline int negamax(int alpha, int beta, int depth) {
    // initializing length of current variation
    pvLength[ply] = ply;

    int score;

    int bestMove = 0;

    int hashFlag = ALPHA;

    if ((ply && isRepetition()) || fiftyRuleCounter >= 100) {
        // if repetition is found \ 50 move rule found -> return draw value
        return 0;
    }


    // checking if current node is PV or not
    int pvNode = beta - alpha > 1;


    if (ply && (score = readHashEntry(alpha, beta, &bestMove, depth)) != NO_HASH_FOUND && pvNode == 0) {
        // if search deep is bigger than 0 AND hash entry was found, AND current node is not a PV node -> return score found in entry
        return score;
    }


    if ((nodes & 2047) == 0) {
        // check for GUI/user input
        communicate();
    }


    if (depth == 0) {

        // no more depth to search in negamax, go to quiet search(escape condition)
        return quietSearch(alpha, beta);
    }


    if (ply > MAX_PLY - 1) {
        // in case we are to deep in the search -> return evaluation of the board
        return evaluate();
    }

    nodes++;

    // checking for checks
    int isInCheck = isSquareAttacked((side == WHITE) ? getLSBIndex(bitboardsPieces[K]) : getLSBIndex(bitboardsPieces[k]),
                                     side ^ 1);


    if (isInCheck) {
        // if in check -> scan deeper
        depth++;
    }


    int legalMoves = 0;



    // evaluation pruning / static null move pruning
    int staticEval = evaluate();
    if (depth < 3 && !pvNode && !isInCheck && abs(beta - 1) > -INFINITY + 100) {
        int evalMargin = 120 * depth;
        if (staticEval - evalMargin >= beta) {
            return staticEval - evalMargin;
        }

    }

    // null move pruning -> making another move from oppononet before continue evaluating to prune more moves
    if (depth >= 3 && isInCheck == 0 && ply) {

        copyBoard();
        ply++;

        // updating repetition table
        repetitionIndex++;
        repetitionTable[repetitionIndex] = hashKey;

        // switch sides and fix hashing for switching sides
        if (enpassant != NO_SQUARE)
            hashKey ^= enpassantKeys[enpassant];
        enpassant = NO_SQUARE;

        side ^= 1;
        hashKey ^= sideKey;

        // searching with smaller depth, with considiration on limit reduction
        score = -negamax(-beta, -beta + 1, depth - 1 - 2);


        ply--;
        repetitionIndex--;
        restoreBoard();


        if (isStopped == 1) {
            // flag to stop, quit searching
            return 0;
        }

        if (score >= beta) {
            // node (position) fails high
            return beta;
        }

    }

    // razoring
    if (!pvNode && !isInCheck && depth <= 3) {
        // get static eval and add first bonus
        score = evaluate() + 125;

        // define new score
        int newScore;

        // static evaluation indicates a fail-low node
        if (score < beta) {
            // on depth 1
            if (depth == 1) {
                // get quiscence score
                newScore = quietSearch(alpha, beta);

                // return quiescence score if it's greater then static evaluation score
                return (newScore > score) ? newScore : score;
            }

            // add second bonus to static evaluation
            score += 175;

            // static evaluation indicates a fail-low node
            if (score < beta && depth <= 2) {
                // get quiscence score
                newScore = quietSearch(alpha, beta);

                // quiescence score indicates fail-low node
                if (newScore < beta)
                    // return quiescence score if it's greater then static evaluation score
                    return (newScore > score) ? newScore : score;
            }
        }
    }


    moves moveList[1];
    generateMoves(moveList);


    if (followPV) {
        //following Principal variation Line(PV) ->  enable PV move scoring
        enablePvScoring(moveList);
    }

    sortMoves(moveList, bestMove);

    // number of moves searched in a move list
    int movesSearched = 0;


    for (int count = 0; count < moveList->count; count++) {

        copyBoard();
        ply++;

        // updating repetition table
        repetitionIndex++;
        repetitionTable[repetitionIndex] = hashKey;


        if (makeMove(moveList->moves[count], ALL_MOVES) == 0) {
            // if invalid move -> go back to another move
            ply--;
            repetitionIndex--;
            continue;
        }

        legalMoves++;


        if (movesSearched == 0) {
            // no search occured yet -> search normally
            score = -negamax(-beta, -alpha, depth - 1);
        }
            // Late Move Reduction
        else {
            // condition to consider LMR
            if (
                    movesSearched >= fullDepthMoves &&
                    depth >= reductionLimit &&
                    isInCheck == 0 &&
                    getMoveCapture(moveList->moves[count]) == 0 &&
                    getMovePromoted(moveList->moves[count]) == 0)
                // search current move with reduced depth:
                score = -negamax(-alpha - 1, -alpha, depth - 2);

                // ensure full depth is going to be done
            else
                score = alpha + 1;

            // principle variation search PVS
            if (score > alpha) {
                //Focusing on Principal Variation
                score = -negamax(-alpha - 1, -alpha, depth - 1);

                // If Reduction was wrong -> try and fixed it with search with more depth and normal alpha beta score bounds
                if ((score > alpha) && (score < beta)) {
                    score = -negamax(-beta, -alpha, depth - 1);
                }

            }
        }

        ply--;
        repetitionIndex--;
        restoreBoard();


        if (isStopped == 1) {
            // Stop search due to signal by user \ GUI
            return 0;
        }


        movesSearched++;


        if (score > alpha) {
            // found a better move -> mark this move as Principal variation Node
            hashFlag = PV;

            bestMove = moveList->moves[count];

            if (getMoveCapture(moveList->moves[count]) == 0) {
                // if not a capture -> store as history move
                historyMoves[getMovePiece(moveList->moves[count])][getMoveTarget(
                        moveList->moves[count])] += depth;

            }

            // PV node (position), writing it to PV table
            alpha = score;
            pvTable[ply][ply] = moveList->moves[count];
            for (int nextPly = ply + 1; nextPly < pvLength[ply + 1]; nextPly++) {
                // copy move from deeper ply into a current ply's line
                pvTable[ply][nextPly] = pvTable[ply + 1][nextPly];
            }
            pvLength[ply] = pvLength[ply + 1];


            if (score >= beta) {
                // storing move as beta
                writeHashEntry(beta, bestMove, depth, BETA);


                if (getMoveCapture(moveList->moves[count]) == 0) {
                    // on quiet moves -> store killer moves
                    killerMoves[1][ply] = killerMoves[0][ply];
                    killerMoves[0][ply] = moveList->moves[count];
                }

                // node (position) fails high
                return beta;
            }
        }
    }


    if (legalMoves == 0) {
        // we don't have any legal moves to make in the current postion -> check for mate or stalmate
        if (isInCheck) {
            // Mate: returning MATE_VALUE + ply to consider fast mate first
            return -MATE_VALUE + ply;
        } else {
            // StalMate ->  return draw score
            return 0;
        }

    }

    // store hash entry with the score equal to alpha
    writeHashEntry(alpha, bestMove, depth, hashFlag);

    // return fail low score
    return alpha;
}